

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O0

void __thiscall
google::protobuf::UninterpretedOption_NamePart::InternalSwap
          (UninterpretedOption_NamePart *this,UninterpretedOption_NamePart *other)

{
  InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,google::protobuf::internal::InternalMetadataWithArena>
  *this_00;
  UninterpretedOption_NamePart *this_01;
  InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
  *__b;
  InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
  *in_RSI;
  long in_RDI;
  UnknownFieldSet *in_stack_ffffffffffffff28;
  InternalMetadataWithArena *in_stack_ffffffffffffff30;
  
  this_00 = (InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,google::protobuf::internal::InternalMetadataWithArena>
             *)(in_RSI + 1);
  if (((uint)*(undefined8 *)(in_RDI + 8) & 1) != 1) {
    if (((uint)*(undefined8 *)this_00 & 1) != 1) goto LAB_00513ab6;
  }
  if (((uint)*(undefined8 *)this_00 & 1) == 1) {
    internal::
    InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,google::protobuf::internal::InternalMetadataWithArena>
    ::
    PtrValue<google::protobuf::internal::InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,google::protobuf::internal::InternalMetadataWithArena>::Container>
              (this_00);
  }
  else {
    internal::
    InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
    ::mutable_unknown_fields_slow(in_RSI);
  }
  internal::InternalMetadataWithArena::DoSwap(in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
LAB_00513ab6:
  std::swap<unsigned_int>((uint *)(in_RDI + 0x10),(uint *)(in_RSI + 2));
  this_01 = (UninterpretedOption_NamePart *)(in_RDI + 0x18);
  __b = in_RSI + 3;
  internal::GetEmptyStringAlreadyInited_abi_cxx11_();
  GetArenaNoVirtual(this_01);
  std::swap<std::__cxx11::string*>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)this_01,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)__b);
  std::swap<bool>((bool *)(in_RDI + 0x20),(bool *)(in_RSI + 4));
  return;
}

Assistant:

void UninterpretedOption_NamePart::InternalSwap(UninterpretedOption_NamePart* other) {
  using std::swap;
  _internal_metadata_.Swap(&other->_internal_metadata_);
  swap(_has_bits_[0], other->_has_bits_[0]);
  name_part_.Swap(&other->name_part_, &::PROTOBUF_NAMESPACE_ID::internal::GetEmptyStringAlreadyInited(),
    GetArenaNoVirtual());
  swap(is_extension_, other->is_extension_);
}